

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idas.c
# Opt level: O2

int IDAQuadSensSVtolerances(void *ida_mem,sunrealtype reltolQS,N_Vector *abstolQS)

{
  int iVar1;
  void *__ptr;
  undefined8 uVar2;
  void *pvVar3;
  int error_code;
  char *msgfmt;
  ulong uVar4;
  long lVar5;
  double dVar6;
  
  if (ida_mem == (void *)0x0) {
    msgfmt = "ida_mem = NULL illegal.";
    error_code = -0x14;
    ida_mem = (IDAMem)0x0;
    iVar1 = 0x839;
  }
  else if (*(int *)((long)ida_mem + 0x9c) == 0) {
    msgfmt = "Illegal attempt to call before calling IDASensInit.";
    error_code = -0x28;
    iVar1 = 0x841;
  }
  else if (*(int *)((long)ida_mem + 0x6c0) == 0) {
    msgfmt = "Forward sensitivity analysis for quadrature variables was not activated.";
    error_code = -0x32;
    iVar1 = 0x849;
  }
  else if (0.0 <= reltolQS) {
    if (abstolQS != (N_Vector *)0x0) {
      __ptr = malloc((long)*(int *)((long)ida_mem + 0xa0) << 3);
      lVar5 = 0;
      while( true ) {
        uVar4 = (ulong)*(int *)((long)ida_mem + 0xa0);
        if ((long)uVar4 <= lVar5) break;
        dVar6 = (double)N_VMin(abstolQS[lVar5]);
        *(double *)((long)__ptr + lVar5 * 8) = dVar6;
        lVar5 = lVar5 + 1;
        if (dVar6 < 0.0) {
          IDAProcessError((IDAMem)ida_mem,-0x16,0x864,"IDAQuadSensSVtolerances",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                          ,"abstolQS has negative component(s) (illegal).");
          free(__ptr);
          return -0x16;
        }
      }
      *(undefined4 *)((long)ida_mem + 0x130) = 2;
      *(sunrealtype *)((long)ida_mem + 0x138) = reltolQS;
      if (*(int *)((long)ida_mem + 0x6b8) == 0) {
        uVar2 = N_VCloneVectorArray(*(int *)((long)ida_mem + 0xa0),*abstolQS);
        *(undefined8 *)((long)ida_mem + 0x148) = uVar2;
        uVar4 = (ulong)*(int *)((long)ida_mem + 0xa0);
        pvVar3 = malloc(uVar4 * 4);
        *(void **)((long)ida_mem + 0x150) = pvVar3;
        *(long *)((long)ida_mem + 0x678) =
             *(long *)((long)ida_mem + 0x678) + *(long *)((long)ida_mem + 0x668) * uVar4;
        *(long *)((long)ida_mem + 0x680) =
             *(long *)((long)ida_mem + 0x680) + uVar4 * *(long *)((long)ida_mem + 0x670);
        *(undefined4 *)((long)ida_mem + 0x6b8) = 1;
      }
      for (lVar5 = 0; lVar5 < (int)uVar4; lVar5 = lVar5 + 1) {
        *(undefined8 *)(*(long *)((long)ida_mem + 0x7f8) + lVar5 * 8) = 0x3ff0000000000000;
        *(uint *)(*(long *)((long)ida_mem + 0x150) + lVar5 * 4) =
             -(uint)(*(double *)((long)__ptr + lVar5 * 8) == 0.0) & 1;
        uVar4 = (ulong)*(uint *)((long)ida_mem + 0xa0);
      }
      free(__ptr);
      iVar1 = N_VScaleVectorArray(uVar4 & 0xffffffff,*(undefined8 *)((long)ida_mem + 0x7f8),abstolQS
                                  ,*(undefined8 *)((long)ida_mem + 0x148));
      if (iVar1 != 0) {
        return -0x1c;
      }
      return 0;
    }
    msgfmt = "abstolQS = NULL illegal parameter.";
    error_code = -0x16;
    iVar1 = 0x859;
  }
  else {
    msgfmt = "reltolQS < 0 illegal parameter.";
    error_code = -0x16;
    iVar1 = 0x852;
  }
  IDAProcessError((IDAMem)ida_mem,error_code,iVar1,"IDAQuadSensSVtolerances",
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/idas/idas.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

int IDAQuadSensSVtolerances(void* ida_mem, sunrealtype reltolQS,
                            N_Vector* abstolQS)
{
  IDAMem IDA_mem;
  int is, retval;
  sunrealtype* atolmin;

  if (ida_mem == NULL)
  {
    IDAProcessError(NULL, IDA_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (IDA_MEM_NULL);
  }
  IDA_mem = (IDAMem)ida_mem;

  /* Check if sensitivity analysis is active */
  if (!IDA_mem->ida_sensi)
  {
    IDAProcessError(IDA_mem, IDA_NO_SENS, __LINE__, __func__, __FILE__,
                    MSG_NO_SENSI);
    return (IDA_NO_SENS);
  }

  /* Was sensitivity for quadrature already initialized? */
  if (!IDA_mem->ida_quadSensMallocDone)
  {
    IDAProcessError(IDA_mem, IDA_NO_QUADSENS, __LINE__, __func__, __FILE__,
                    MSG_NO_QUADSENSI);
    return (IDA_NO_QUADSENS);
  }

  /* Test user-supplied tolerances */

  if (reltolQS < ZERO)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_BAD_RELTOLQS);
    return (IDA_ILL_INPUT);
  }

  if (abstolQS == NULL)
  {
    IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_NULL_ABSTOLQS);
    return (IDA_ILL_INPUT);
  }

  atolmin = (sunrealtype*)malloc(IDA_mem->ida_Ns * sizeof(sunrealtype));
  for (is = 0; is < IDA_mem->ida_Ns; is++)
  {
    atolmin[is] = N_VMin(abstolQS[is]);
    if (atolmin[is] < ZERO)
    {
      IDAProcessError(IDA_mem, IDA_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_BAD_ABSTOLQS);
      free(atolmin);
      return (IDA_ILL_INPUT);
    }
  }

  /* Save data. */
  IDA_mem->ida_itolQS = IDA_SV;
  IDA_mem->ida_rtolQS = reltolQS;

  if (!(IDA_mem->ida_VatolQSMallocDone))
  {
    IDA_mem->ida_VatolQS = N_VCloneVectorArray(IDA_mem->ida_Ns, abstolQS[0]);
    IDA_mem->ida_atolQSmin0 =
      (sunbooleantype*)malloc(IDA_mem->ida_Ns * sizeof(sunbooleantype));
    IDA_mem->ida_lrw += IDA_mem->ida_Ns * IDA_mem->ida_lrw1Q;
    IDA_mem->ida_liw += IDA_mem->ida_Ns * IDA_mem->ida_liw1Q;
    IDA_mem->ida_VatolQSMallocDone = SUNTRUE;
  }

  for (is = 0; is < IDA_mem->ida_Ns; is++)
  {
    IDA_mem->ida_cvals[is]      = ONE;
    IDA_mem->ida_atolQSmin0[is] = (atolmin[is] == ZERO);
  }
  free(atolmin);

  retval = N_VScaleVectorArray(IDA_mem->ida_Ns, IDA_mem->ida_cvals, abstolQS,
                               IDA_mem->ida_VatolQS);
  if (retval != IDA_SUCCESS) { return (IDA_VECTOROP_ERR); }

  return (IDA_SUCCESS);
}